

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::ExpressionConstraint::fromSyntax(ExpressionConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *compilation;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ExpressionConstraint *ctrl;
  Constraint *pCVar3;
  bool isSoft;
  ConstraintExprVisitor visitor;
  bool local_31;
  ConstraintExprVisitor local_30;
  Expression *args;
  
  compilation = ((context->scope).ptr)->compilation;
  local_31 = (syntax->soft).kind == SoftKeyword;
  iVar2 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  ctrl = BumpAllocator::
         emplace<slang::ast::ExpressionConstraint,slang::ast::Expression_const&,bool&>
                   (&compilation->super_BumpAllocator,args,&local_31);
  bVar1 = Expression::bad(args);
  if (!bVar1) {
    local_30.failed = false;
    local_30.isTop = true;
    local_30.sawRandVars = false;
    local_30.isSoft = local_31;
    local_30.context = context;
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>(args,&local_30);
    if (bVar1) {
      return &ctrl->super_Constraint;
    }
  }
  pCVar3 = Constraint::badConstraint(compilation,&ctrl->super_Constraint);
  return pCVar3;
}

Assistant:

Constraint& ExpressionConstraint::fromSyntax(const ExpressionConstraintSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    bool isSoft = syntax.soft.kind == TokenKind::SoftKeyword;
    auto& expr = Expression::bind(*syntax.expr, context);
    auto result = comp.emplace<ExpressionConstraint>(expr, isSoft);
    if (expr.bad())
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, isSoft);
    if (!expr.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}